

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::DecodeQuantizedDataInfo
          (SequentialQuantizationAttributeDecoder *this)

{
  bool bVar1;
  PointAttribute *pPVar2;
  PointCloudDecoder *this_00;
  DecoderBuffer *in_RDI;
  PointAttribute *unaff_retaddr;
  AttributeQuantizationTransform *in_stack_00000008;
  PointAttribute *att;
  DecoderBuffer *decoder_buffer;
  
  decoder_buffer = in_RDI;
  pPVar2 = SequentialAttributeDecoder::GetPortableAttribute
                     ((SequentialAttributeDecoder *)unaff_retaddr);
  if (pPVar2 == (PointAttribute *)0x0) {
    SequentialAttributeDecoder::attribute((SequentialAttributeDecoder *)in_RDI);
  }
  this_00 = SequentialAttributeDecoder::decoder((SequentialAttributeDecoder *)in_RDI);
  PointCloudDecoder::buffer(this_00);
  bVar1 = AttributeQuantizationTransform::DecodeParameters
                    (in_stack_00000008,unaff_retaddr,decoder_buffer);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::DecodeQuantizedDataInfo() {
  // Get attribute used as source for decoding.
  auto att = GetPortableAttribute();
  if (att == nullptr) {
    // This should happen only in the backward compatibility mode. It will still
    // work fine for this case because the only thing the quantization transform
    // cares about is the number of components that is the same for both source
    // and target attributes.
    att = attribute();
  }
  return quantization_transform_.DecodeParameters(*att, decoder()->buffer());
}